

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O2

void __thiscall Fl_Scroll::scroll_to(Fl_Scroll *this,int X,int Y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Widget *this_00;
  Fl_Window *pFVar4;
  Fl_Widget **ppFVar5;
  Fl_Window *pFVar6;
  long lVar7;
  uchar fl;
  
  iVar1 = this->xposition_;
  iVar2 = this->yposition_;
  if (iVar2 != Y || iVar1 != X) {
    this->xposition_ = X;
    this->yposition_ = Y;
    ppFVar5 = Fl_Group::array(&this->super_Fl_Group);
    iVar3 = (this->super_Fl_Group).children_;
    for (lVar7 = 0; iVar3 != (int)lVar7; lVar7 = lVar7 + 1) {
      this_00 = ppFVar5[lVar7];
      if ((Fl_Scrollbar *)this_00 != &this->scrollbar &&
          (Fl_Scrollbar *)this_00 != &this->hscrollbar) {
        Fl_Widget::position(this_00,this_00->x_ + (iVar1 - X),this_00->y_ + (iVar2 - Y));
      }
    }
    pFVar4 = (Fl_Window *)(this->super_Fl_Group).super_Fl_Widget.parent_;
    pFVar6 = Fl_Widget::window((Fl_Widget *)this);
    fl = 0x80;
    if (Fl::scheme_bg_ == (Fl_Image *)0x0) {
      fl = '\x04';
    }
    if (pFVar4 != pFVar6) {
      fl = '\x04';
    }
    Fl_Widget::damage((Fl_Widget *)this,fl);
    return;
  }
  return;
}

Assistant:

void Fl_Scroll::scroll_to(int X, int Y) {
  int dx = xposition_-X;
  int dy = yposition_-Y;
  if (!dx && !dy) return;
  xposition_ = X;
  yposition_ = Y;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o == &hscrollbar || o == &scrollbar) continue;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (parent() == (Fl_Group *)window() && Fl::scheme_bg_) damage(FL_DAMAGE_ALL);
  else damage(FL_DAMAGE_SCROLL);
}